

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertForCygwin.cpp
# Opt level: O2

string * __thiscall
ApprovalTests::DoNothing::convertProgramForCygwin
          (string *__return_storage_ptr__,DoNothing *this,string *filePath)

{
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)filePath);
  return __return_storage_ptr__;
}

Assistant:

std::string DoNothing::convertProgramForCygwin(const std::string& filePath)
    {
        return filePath;
    }